

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O2

Vec_Ptr_t * Vec_PtrDupStr(Vec_Ptr_t *pVec)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **__dest;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  uVar1 = pVec->nSize;
  pVVar3->nSize = uVar1;
  iVar2 = pVec->nCap;
  uVar5 = 0;
  pVVar3->nCap = iVar2;
  if ((long)iVar2 == 0) {
    __dest = (void **)0x0;
  }
  else {
    __dest = (void **)malloc((long)iVar2 << 3);
  }
  pVVar3->pArray = __dest;
  memcpy(__dest,pVec->pArray,(long)(int)uVar1 << 3);
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pcVar4 = Abc_UtilStrsav((char *)__dest[uVar5]);
    __dest[uVar5] = pcVar4;
  }
  return pVVar3;
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrDupStr( Vec_Ptr_t * pVec )
{
    int i;
    Vec_Ptr_t * p = Vec_PtrDup( pVec );
    for ( i = 0; i < p->nSize; i++ )
        p->pArray[i] = Abc_UtilStrsav( (char *)p->pArray[i] );
    return p;
}